

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O3

void __thiscall discordpp::ThreadMetadata::~ThreadMetadata(ThreadMetadata *this)

{
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  _Head_base<0UL,_int_*,_false> _Var3;
  _Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_> _Var4;
  pointer *__ptr;
  
  _Var1._M_head_impl =
       (this->create_timestamp).
       super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .t_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&(this->create_timestamp).
                     super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ,_Var1._M_head_impl);
  }
  (this->create_timestamp).
  super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.t_.
  _M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var2._M_head_impl =
       (this->invitable).super_field<bool>.t_._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (bool *)0x0) {
    operator_delete(_Var2._M_head_impl,1);
  }
  (this->invitable).super_field<bool>.t_._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  _Var2._M_head_impl =
       (this->locked).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (bool *)0x0) {
    operator_delete(_Var2._M_head_impl,1);
  }
  (this->locked).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  _Var1._M_head_impl =
       (this->archive_timestamp).t_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
     ) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&this->archive_timestamp,_Var1._M_head_impl);
  }
  (this->archive_timestamp).t_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var3._M_head_impl =
       (this->auto_archive_duration).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (int *)0x0) {
    operator_delete(_Var3._M_head_impl,4);
  }
  (this->auto_archive_duration).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  _Var4.super__Head_base<0UL,_bool_*,_false>._M_head_impl =
       (this->archived).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>;
  if (_Var4.super__Head_base<0UL,_bool_*,_false>._M_head_impl != (bool *)0x0) {
    operator_delete((void *)_Var4.super__Head_base<0UL,_bool_*,_false>._M_head_impl,1);
  }
  (this->archived).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false> =
       (_Head_base<0UL,_bool_*,_false>)0x0;
  return;
}

Assistant:

ThreadMetadata(
        field<bool> archived = uninitialized,
        field<int> auto_archive_duration = uninitialized,
        field<Timestamp> archive_timestamp = uninitialized,
        field<bool> locked = uninitialized,
        omittable_field<bool> invitable = omitted,
        nullable_omittable_field<Timestamp> create_timestamp = omitted
    ):
        archived(archived),
        auto_archive_duration(auto_archive_duration),
        archive_timestamp(archive_timestamp),
        locked(locked),
        invitable(invitable),
        create_timestamp(create_timestamp)
    {}